

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Param * __thiscall
kratos::Generator::parameter
          (Generator *this,shared_ptr<kratos::Param> *param,string *parameter_name)

{
  element_type *peVar1;
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  shared_ptr<kratos::Param> ptr;
  string *parameter_name_local;
  shared_ptr<kratos::Param> *param_local;
  Generator *this_local;
  
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parameter_name;
  check_param_name_conflict(this,parameter_name);
  local_38 = (undefined1  [8])this;
  std::
  make_shared<kratos::Param,kratos::Generator*,std::shared_ptr<kratos::Param>const&,std::__cxx11::string_const&>
            ((Generator **)local_30,(shared_ptr<kratos::Param> *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Param>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Param>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Param> *)local_30);
  peVar1 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )local_30);
  std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)local_30);
  return peVar1;
}

Assistant:

Param &Generator::parameter(const std::shared_ptr<Param> &param,
                            const std::string &parameter_name) {
    check_param_name_conflict(parameter_name);
    auto ptr = std::make_shared<Param>(this, param, parameter_name);
    params_.emplace(parameter_name, ptr);
    return *ptr;
}